

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  UInt32 UVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = (ulong)p->tableSize;
  uVar5 = (p->p).choice >> 2 & 0xfffffffc;
  iVar1 = *(int *)((long)ProbPrices + (ulong)uVar5);
  iVar2 = *(int *)((long)ProbPrices + (ulong)(uVar5 ^ 0x1fc));
  uVar5 = (p->p).choice2 >> 2 & 0xfffffffc;
  iVar3 = *(int *)((long)ProbPrices + (ulong)uVar5);
  iVar4 = *(int *)((long)ProbPrices + (ulong)(uVar5 ^ 0x1fc));
  for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
    if (uVar7 == uVar9) goto LAB_0017ea5c;
    UVar6 = RcTree_GetPrice((p->p).low + (posState << 3),3,(UInt32)uVar9,ProbPrices);
    p->prices[posState][uVar9] = UVar6 + iVar1;
  }
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    if (uVar7 <= lVar8 + 8U) goto LAB_0017ea5c;
    UVar6 = RcTree_GetPrice((p->p).mid + (posState << 3),3,(UInt32)lVar8,ProbPrices);
    p->prices[posState][lVar8 + 8] = UVar6 + iVar3 + iVar2;
  }
  for (lVar8 = 0; lVar8 + 0x10U < uVar7; lVar8 = lVar8 + 1) {
    UVar6 = RcTree_GetPrice((p->p).high,8,(UInt32)lVar8,ProbPrices);
    p->prices[posState][lVar8 + 0x10] = UVar6 + iVar2 + iVar4;
  }
LAB_0017ea5c:
  p->counters[posState] = p->tableSize;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc* p, UInt32 posState, UInt32* ProbPrices) {
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}